

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O1

X509_VERIFY_PARAM * X509_VERIFY_PARAM_new(void)

{
  X509_VERIFY_PARAM *pXVar1;
  
  pXVar1 = (X509_VERIFY_PARAM *)OPENSSL_zalloc(0x60);
  if (pXVar1 == (X509_VERIFY_PARAM *)0x0) {
    pXVar1 = (X509_VERIFY_PARAM *)0x0;
  }
  else {
    *(undefined4 *)&pXVar1->flags = 0xffffffff;
  }
  return pXVar1;
}

Assistant:

X509_VERIFY_PARAM *X509_VERIFY_PARAM_new(void) {
  X509_VERIFY_PARAM *param = reinterpret_cast<X509_VERIFY_PARAM *>(
      OPENSSL_zalloc(sizeof(X509_VERIFY_PARAM)));
  if (!param) {
    return NULL;
  }
  param->depth = -1;
  return param;
}